

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microterm.cpp
# Opt level: O0

void __thiscall MicroTerm::MicroTerm(MicroTerm *this,char *t0,char *t1)

{
  char *pcVar1;
  Stream *pSVar2;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  char *local_20;
  char *t1_local;
  char *t0_local;
  MicroTerm *this_local;
  
  local_20 = t1;
  t1_local = t0;
  t0_local = (char *)this;
  Dashel::Hub::Hub(&this->super_Hub,true);
  pcVar1 = t1_local;
  *(undefined ***)this = &PTR__MicroTerm_00106d38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,pcVar1,&local_41);
  pSVar2 = (Stream *)Dashel::Hub::connect((string *)this);
  this->s0 = pSVar2;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,pcVar1,&local_79);
  pSVar2 = (Stream *)Dashel::Hub::connect((string *)this);
  this->s1 = pSVar2;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

MicroTerm(const char* t0, const char* t1)
	{
		s0 = connect(t0);
		s1 = connect(t1);
	}